

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Scrollbar(ImGuiLayoutType direction)

{
  bool bVar1;
  ImGuiWindow *this;
  ImDrawList *this_00;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  ImGuiID IVar8;
  ImU32 IVar9;
  ImVec2 *pIVar10;
  ImRect *pIVar11;
  char *str;
  int iVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  bool bVar19;
  bool hovered;
  bool held;
  bool local_dd;
  undefined1 local_dc [8];
  ImVec2 local_d4;
  bool local_c9;
  undefined1 local_c8 [16];
  ImGuiID local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  ImGuiID local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [12];
  float fStack_6c;
  ImVec2 *local_68;
  ImVec2 *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pIVar6 = GImGui;
  local_88._8_8_ = local_88._0_8_;
  local_98._8_8_ = local_98._0_8_;
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (direction == 1) {
    str = "#SCROLLX";
  }
  local_9c = ImGuiWindow::GetID(this,str,(char *)0x0);
  bVar1 = (&this->ScrollbarX)[direction == 1];
  local_c8._0_4_ = 0.0;
  if (bVar1 == true) {
    local_c8._0_4_ = (pIVar6->Style).ScrollbarSize;
  }
  local_dc._0_4_ = (this->Pos).x;
  local_dc._4_4_ = (this->Pos).y;
  local_a4 = (this->Size).x + (float)local_dc._0_4_;
  local_a8 = (this->Size).y + (float)local_dc._4_4_;
  fVar14 = this->WindowBorderSize;
  if (direction == 1) {
    local_dc._4_4_ = local_a8 - (pIVar6->Style).ScrollbarSize;
    local_dc._0_4_ = (float)local_dc._0_4_ + fVar14;
    local_d4.y = local_a8;
    local_d4.x = local_a4 - (float)local_c8._0_4_;
  }
  else {
    local_dc._0_4_ = local_a4 - (pIVar6->Style).ScrollbarSize;
    local_dc._4_4_ = (float)local_dc._4_4_ + fVar14;
    local_d4.y = local_a8 - (float)local_c8._0_4_;
    local_d4.x = local_a4;
  }
  local_d4.y = local_d4.y - fVar14;
  local_d4.x = local_d4.x - fVar14;
  if (direction != 1) {
    fVar15 = 0.0;
    fVar14 = 0.0;
    if ((this->Flags & 1U) == 0) {
      fVar14 = (GImGui->Style).FramePadding.y;
      fVar14 = fVar14 + fVar14 + GImGui->FontBaseSize * this->FontWindowScale;
    }
    if (((uint)this->Flags >> 10 & 1) != 0) {
      fVar15 = (GImGui->Style).FramePadding.y;
      fVar15 = fVar15 + fVar15 +
               GImGui->FontBaseSize * this->FontWindowScale + (this->DC).MenuBarOffset.y;
    }
    local_dc._4_4_ = fVar14 + fVar15 + (float)local_dc._4_4_;
  }
  if ((0.0 < local_d4.x - (float)local_dc._0_4_) && (0.0 < local_d4.y - (float)local_dc._4_4_)) {
    if (direction == 1) {
      iVar12 = (uint)(bVar1 ^ 1) * 8 + 4;
      local_88._0_8_ = 0x20;
      local_98._0_8_ = 0x30;
    }
    else {
      iVar12 = ((uint)~this->Flags >> 9 & -(this->Flags & 1U) & 2) + (uint)(bVar1 ^ 1) * 8;
      local_88._0_8_ = 0x24;
      local_98._0_8_ = 0x34;
    }
    this_00 = this->DrawList;
    local_78._0_8_ = *(ImVec2 *)((GImGui->Style).Colors + 0xe);
    uVar3 = (GImGui->Style).Colors[0xe].z;
    uVar4 = (GImGui->Style).Colors[0xe].w;
    fStack_6c = (GImGui->Style).Alpha * (float)uVar4;
    local_78._8_4_ = uVar3;
    IVar9 = ColorConvertFloat4ToU32((ImVec4 *)local_78);
    ImDrawList::AddRectFilled
              (this_00,(ImVec2 *)local_dc,&local_d4,IVar9,this->WindowRounding,iVar12);
    IVar8 = local_9c;
    fVar14 = ((local_d4.x - (float)local_dc._0_4_) + -2.0) * 0.5;
    iVar12 = (int)fVar14;
    fVar16 = -3.0;
    fVar15 = -3.0;
    if (iVar12 < 4) {
      fVar15 = -(float)(int)fVar14;
    }
    fVar14 = -0.0;
    if (-1 < iVar12) {
      fVar14 = fVar15;
    }
    fVar15 = ((local_d4.y - (float)local_dc._4_4_) + -2.0) * 0.5;
    iVar12 = (int)fVar15;
    if (iVar12 < 4) {
      fVar16 = -(float)(int)fVar15;
    }
    fVar15 = -0.0;
    if (-1 < iVar12) {
      fVar15 = fVar16;
    }
    local_dc._0_4_ = (float)local_dc._0_4_ - fVar14;
    local_dc._4_4_ = (float)local_dc._4_4_ - fVar15;
    local_d4.x = local_d4.x + fVar14;
    local_d4.y = local_d4.y + fVar15;
    if (direction == 1) {
      local_a0 = local_d4.x - (float)local_dc._0_4_;
    }
    else {
      local_a0 = local_d4.y - (float)local_dc._4_4_;
    }
    fVar15 = *(float *)((long)&this->Name + local_88._0_8_) - (float)local_c8._0_4_;
    fVar14 = *(float *)((long)&this->Name + local_98._0_8_);
    local_88 = ZEXT416((uint)fVar14);
    fVar14 = (float)(~-(uint)(fVar15 <= fVar14) & (uint)fVar15 |
                    -(uint)(fVar15 <= fVar14) & (uint)fVar14);
    if (fVar14 <= 0.0) {
      __assert_fail("ImMax(win_size_contents_v, win_size_avail_v) > 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1939,"void ImGui::Scrollbar(ImGuiLayoutType)");
    }
    local_60 = &this->Scroll;
    local_68 = (ImVec2 *)&(this->Scroll).y;
    pIVar10 = local_68;
    if (direction == 1) {
      pIVar10 = local_60;
    }
    local_c8 = ZEXT416((uint)pIVar10->x);
    if (fVar14 <= 1.0) {
      fVar14 = 1.0;
    }
    fVar17 = (fVar15 / fVar14) * local_a0;
    fVar14 = (pIVar6->Style).GrabMinSize;
    fVar16 = local_a0;
    if (fVar17 <= local_a0) {
      fVar16 = fVar17;
    }
    uVar13 = -(uint)(fVar17 < fVar14);
    local_48 = ZEXT416((uint)fVar15);
    fVar14 = (float)(uVar13 & (uint)fVar14 | ~uVar13 & (uint)fVar16);
    local_98 = ZEXT416((uint)fVar14);
    local_58 = ZEXT416((uint)(fVar14 / local_a0));
    local_c9 = false;
    local_dd = false;
    local_ac = pIVar6->ActiveId;
    ButtonBehavior((ImRect *)local_dc,local_9c,&local_dd,&local_c9,0x2000);
    pIVar7 = GImGui;
    fVar14 = 1.0;
    if (1.0 <= (float)local_88._0_4_ - (float)local_48._0_4_) {
      fVar14 = (float)local_88._0_4_ - (float)local_48._0_4_;
    }
    local_c8._0_4_ = (float)local_c8._0_4_ / fVar14;
    fVar15 = 1.0;
    if ((float)local_c8._0_4_ <= 1.0) {
      fVar15 = (float)local_c8._0_4_;
    }
    fVar15 = ((float)(~-(uint)((float)local_c8._0_4_ < 0.0) & (uint)fVar15) *
             (local_a0 - (float)local_98._0_4_)) / local_a0;
    if (1.0 <= (float)local_58._0_4_ || local_c9 != true) {
      local_c8 = ZEXT416((uint)fVar15);
    }
    else {
      pIVar11 = (ImRect *)(local_dc + 4);
      if (direction == 1) {
        pIVar11 = (ImRect *)local_dc;
      }
      uVar2 = (ulong)(direction != 1);
      fVar17 = (*(float *)((pIVar6->IO).MouseDown + uVar2 * 4 + -8) - (pIVar11->Min).x) / local_a0;
      fVar16 = 1.0;
      if (fVar17 <= 1.0) {
        fVar16 = fVar17;
      }
      fVar18 = 0.0;
      fVar16 = (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar16);
      GImGui->HoveredId = IVar8;
      pIVar7->HoveredIdAllowOverlap = false;
      if ((IVar8 != 0) && (pIVar7->HoveredIdPreviousFrame == IVar8)) {
        fVar18 = pIVar7->HoveredIdTimer + (pIVar7->IO).DeltaTime;
      }
      pIVar7->HoveredIdTimer = fVar18;
      if (local_ac == IVar8) {
        bVar19 = false;
      }
      else {
        bVar1 = (float)local_58._0_4_ + fVar15 < fVar16;
        bVar19 = bVar1 || fVar16 < fVar15;
        fVar17 = 0.0;
        if (!bVar1 && fVar16 >= fVar15) {
          fVar17 = (float)local_58._0_4_ * -0.5 + (fVar16 - fVar15);
        }
        (&(pIVar6->ScrollbarClickDeltaToGrabCenter).x)[uVar2] = fVar17;
      }
      fVar17 = ((fVar16 - (&(pIVar6->ScrollbarClickDeltaToGrabCenter).x)[uVar2]) -
               (float)local_58._0_4_ * 0.5) / (1.0 - (float)local_58._0_4_);
      fVar15 = 1.0;
      if (fVar17 <= 1.0) {
        fVar15 = fVar17;
      }
      fVar15 = (float)(int)((float)(~-(uint)(fVar17 < 0.0) & (uint)fVar15) * fVar14 + 0.5);
      pIVar10 = local_68;
      if (direction == 1) {
        pIVar10 = local_60;
      }
      pIVar10->x = fVar15;
      fVar15 = fVar15 / fVar14;
      fVar14 = 1.0;
      if (fVar15 <= 1.0) {
        fVar14 = fVar15;
      }
      fVar14 = ((local_a0 - (float)local_98._0_4_) * (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar14))
               / local_a0;
      local_c8 = ZEXT416((uint)fVar14);
      if (bVar19) {
        (&(pIVar6->ScrollbarClickDeltaToGrabCenter).x)[uVar2] =
             -(float)local_58._0_4_ * 0.5 + (fVar16 - fVar14);
      }
    }
    iVar12 = 0x11;
    if (local_c9 == false) {
      iVar12 = (local_dd & 1) + 0xf;
    }
    pIVar10 = (ImVec2 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar12 << 4));
    local_78._0_8_ = *pIVar10;
    IVar5 = pIVar10[1];
    fStack_6c = IVar5.y;
    local_78._8_4_ = IVar5.x;
    fStack_6c = (GImGui->Style).Alpha * fStack_6c;
    IVar9 = ColorConvertFloat4ToU32((ImVec4 *)local_78);
    if (direction == 1) {
      local_78._0_4_ =
           (float)local_dc._0_4_ + (local_d4.x - (float)local_dc._0_4_) * (float)local_c8._0_4_;
      local_78._8_4_ = (float)local_98._0_4_ + (float)local_78._0_4_;
      local_78._4_4_ = local_dc._4_4_;
      fStack_6c = local_d4.y;
      if (local_a4 <= (float)local_78._8_4_) {
        local_78._8_4_ = local_a4;
      }
    }
    else {
      local_78._4_4_ =
           (local_d4.y - (float)local_dc._4_4_) * (float)local_c8._0_4_ + (float)local_dc._4_4_;
      fStack_6c = (float)local_98._0_4_ + (float)local_78._4_4_;
      local_78._8_4_ = local_d4.x;
      local_78._0_4_ = local_dc._0_4_;
      if (local_a8 <= (float)local_98._0_4_ + (float)local_78._4_4_) {
        fStack_6c = local_a8;
      }
    }
    ImDrawList::AddRectFilled
              (this->DrawList,(ImVec2 *)local_78,(ImVec2 *)(local_78 + 8),IVar9,
               (pIVar6->Style).ScrollbarRounding,0xf);
  }
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiLayoutType direction)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (direction == ImGuiLayoutType_Horizontal);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(horizontal ? "#SCROLLX" : "#SCROLLY");

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect window_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(window->Pos.x + border_size, window_rect.Max.y - style.ScrollbarSize, window_rect.Max.x - other_scrollbar_size_w - border_size, window_rect.Max.y - border_size)
        : ImRect(window_rect.Max.x - style.ScrollbarSize, window->Pos.y + border_size, window_rect.Max.x - border_size, window_rect.Max.y - other_scrollbar_size_w - border_size);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f);
    if (bb.GetWidth() <= 0.0f || bb.GetHeight() <= 0.0f)
        return;

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb.Max.x - bb.Min.x - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb.Max.y - bb.Min.y - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, window_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, window_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}